

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall
tetgenmesh::refineregion
          (tetgenmesh *this,face *splitsh,arraypool *cavpoints,arraypool *cavfaces,
          arraypool *cavshells,arraypool *newtets,arraypool *crosstets,arraypool *misfaces)

{
  tetrahedron *pppdVar1;
  shellface *pppdVar2;
  shellface ppdVar3;
  shellface ppdVar4;
  memorypool *pmVar5;
  arraypool *paVar6;
  tetrahedron *pppdVar7;
  point pdVar8;
  int i;
  int iVar9;
  interresult iVar10;
  unsigned_long uVar11;
  tetrahedron ppdVar12;
  undefined4 *puVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  tetrahedron *pppdVar17;
  arraypool *paVar18;
  face splitseg;
  triface searchtet;
  point steinpt;
  long local_b8;
  face *local_b0;
  point refpt;
  insertvertexflags local_a0;
  
  searchtet.tet = (tetrahedron *)0x0;
  searchtet.ver = 0;
  splitseg.sh = (shellface *)0x0;
  splitseg.shver = 0;
  local_a0.refinetet.ver = 0;
  local_a0.refinesh.shver = 0;
  local_a0.refinetet.tet = (tetrahedron *)0x0;
  local_a0.refinesh.sh = (shellface *)0x0;
  local_a0.smlen = 0.0;
  local_a0.lawson = 0;
  local_a0.splitbdflag = 0;
  local_a0.validflag = 0;
  local_a0.respectbdflag = 0;
  local_a0.rejflag = 0;
  local_a0.chkencflag = 0;
  local_a0.cdtflag = 0;
  local_a0.assignmeshsize = 0;
  local_a0.sloc = 0;
  local_a0.sbowywat = 0;
  local_a0.refineflag = 0;
  lVar15 = this->points->items;
  if (2 < this->b->verbose) {
    pppdVar2 = splitsh->sh;
    iVar9 = splitsh->shver;
    lVar16 = (long)this->pointmarkindex;
    printf("      Refining region at edge (%d, %d, %d).\n",
           (ulong)*(uint *)((long)pppdVar2[sorgpivot[iVar9]] + lVar16 * 4),
           (ulong)*(uint *)((long)pppdVar2[sdestpivot[iVar9]] + lVar16 * 4),
           (ulong)*(uint *)((long)pppdVar2[sapexpivot[iVar9]] + lVar16 * 4));
  }
  ppdVar3 = splitsh->sh[sorgpivot[splitsh->shver]];
  ppdVar4 = splitsh->sh[sdestpivot[splitsh->shver]];
  makepoint(this,&steinpt,FREEFACETVERTEX);
  pdVar8 = steinpt;
  lVar16 = 0;
  do {
    steinpt[lVar16] = ((double)ppdVar3[lVar16] + (double)ppdVar4[lVar16]) * 0.5;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 3);
  local_a0.bowywat = 1;
  local_a0.cdtflag = 1;
  local_a0.sloc = 4;
  local_a0.sbowywat = 1;
  local_a0.assignmeshsize = this->b->metric;
  local_a0.smlenflag = this->useinsertradius;
  searchtet.tet = (tetrahedron *)((ulong)ppdVar3[this->point2simindex] & 0xfffffffffffffff0);
  if (searchtet.tet[4] == ppdVar3) {
    searchtet.ver = 0xb;
  }
  else if (searchtet.tet[5] == ppdVar3) {
    searchtet.ver = 3;
  }
  else {
    searchtet.ver = 7;
    if (searchtet.tet[6] != ppdVar3) {
      searchtet.ver = 0;
    }
  }
  local_a0.iloc = 1;
  local_a0.rejflag = 1;
  paVar18 = crosstets;
  iVar9 = insertpoint_cdt(this,steinpt,&searchtet,splitsh,(face *)0x0,&local_a0,cavpoints,cavfaces,
                          cavshells,newtets,crosstets,misfaces);
  local_b8 = lVar15;
  if (iVar9 != 0) {
    if (this->useinsertradius != 0) {
      save_facetpoint_insradius(this,pdVar8,local_a0.parentpt,local_a0.smlen);
    }
    this->st_facref_count = this->st_facref_count + 1;
LAB_00138ced:
    if (0 < this->steinerleft) {
      this->steinerleft = this->steinerleft + -1;
    }
    paVar6 = this->subsegstack;
    lVar15 = paVar6->objects;
    local_b0 = splitsh;
    do {
      if (lVar15 < 1) {
        if (2 < this->b->verbose) {
          printf("      Added %ld Steiner points.\n",this->points->items - local_b8);
        }
        return;
      }
      uVar14 = lVar15 - 1;
      paVar6->objects = uVar14;
      lVar15 = (long)paVar6->objectbytes * ((long)paVar6->objectsperblockmark & uVar14);
      splitseg.sh = *(shellface **)
                     (paVar6->toparray[uVar14 >> ((byte)paVar6->log2objectsperblock & 0x3f)] +
                     lVar15);
      splitseg.shver =
           *(int *)(paVar6->toparray[uVar14 >> ((byte)paVar6->log2objectsperblock & 0x3f)] +
                   lVar15 + 8);
      searchtet.ver = (uint)splitseg.sh[9] & 0xf;
      searchtet.tet = (tetrahedron *)((ulong)splitseg.sh[9] & 0xfffffffffffffff0);
      if (searchtet.tet == (tetrahedron *)0x0) {
        iVar10 = scoutsegment(this,(point)splitseg.sh[sorgpivot[splitseg.shver]],
                              (point)splitseg.sh[sdestpivot[splitseg.shver]],&splitseg,&searchtet,
                              &refpt,paVar18);
        pppdVar7 = searchtet.tet;
        if (iVar10 == SHAREEDGE) {
          uVar14 = (ulong)searchtet.ver;
          splitseg.sh[9] = (shellface)(uVar14 | (ulong)searchtet.tet);
          pppdVar17 = searchtet.tet;
          do {
            ppdVar12 = pppdVar17[8];
            if (ppdVar12 == (tetrahedron)0x0) {
              ppdVar12 = (tetrahedron)memorypool::alloc(this->tet2segpool);
              pppdVar17[8] = ppdVar12;
              lVar15 = 0;
              do {
                pppdVar17[8][lVar15] = (double *)0x0;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 6);
              ppdVar12 = pppdVar17[8];
            }
            iVar9 = (int)uVar14;
            ppdVar12[ver2edge[iVar9]] = (double *)((long)splitseg.shver | (ulong)splitseg.sh);
            pppdVar1 = pppdVar17 + facepivot1[iVar9];
            pppdVar17 = (tetrahedron *)((ulong)*pppdVar1 & 0xfffffffffffffff0);
            uVar14 = (ulong)(uint)facepivot2[iVar9][(uint)*pppdVar1 & 0xf];
          } while (pppdVar7 != pppdVar17);
        }
        else {
          if ((iVar10 & ~INTERSECT) != ACROSSEDGE) goto LAB_00138f92;
          makepoint(this,&steinpt,FREESEGVERTEX);
          pdVar8 = steinpt;
          getsteinerptonsegment(this,&splitseg,refpt,steinpt);
          local_a0.iloc = 1;
          local_a0.rejflag = 0;
          paVar18 = crosstets;
          iVar9 = insertpoint_cdt(this,pdVar8,&searchtet,local_b0,&splitseg,&local_a0,cavpoints,
                                  cavfaces,cavshells,newtets,crosstets,misfaces);
          if (iVar9 == 0) goto LAB_00138f92;
          if (this->useinsertradius != 0) {
            save_segmentpoint_insradius(this,pdVar8,local_a0.parentpt,local_a0.smlen);
          }
          this->st_segref_count = this->st_segref_count + 1;
          if (0 < this->steinerleft) {
            this->steinerleft = this->steinerleft + -1;
          }
        }
      }
      paVar6 = this->subsegstack;
      lVar15 = paVar6->objects;
    } while( true );
  }
  if (local_a0.iloc == 7) {
    *(uint *)((long)pdVar8 + (long)this->pointmarkindex * 4 + 4) =
         *(byte *)((long)pdVar8 + (long)this->pointmarkindex * 4 + 4) | 0xa00;
    pmVar5 = this->points;
    *pdVar8 = (double)pmVar5->deaditemstack;
    pmVar5->deaditemstack = pdVar8;
    pmVar5->items = pmVar5->items + -1;
    uVar11 = randomnation(this,(uint)this->encseglist->objects);
    paVar18 = this->encseglist;
    lVar15 = (long)paVar18->objectbytes * (long)(int)((uint)uVar11 & paVar18->objectsperblockmark);
    splitseg.sh = *(shellface **)
                   (paVar18->toparray
                    [(int)(uint)uVar11 >> ((byte)paVar18->log2objectsperblock & 0x1f)] + lVar15);
    splitseg.shver =
         *(int *)(paVar18->toparray
                  [(int)(uint)uVar11 >> ((byte)paVar18->log2objectsperblock & 0x1f)] + lVar15 + 8);
    paVar18->objects = 0;
    ppdVar3 = splitseg.sh[sorgpivot[splitseg.shver]];
    ppdVar4 = splitseg.sh[sdestpivot[splitseg.shver]];
    makepoint(this,&steinpt,FREESEGVERTEX);
    pdVar8 = steinpt;
    lVar15 = 0;
    do {
      steinpt[lVar15] = ((double)ppdVar3[lVar15] + (double)ppdVar4[lVar15]) * 0.5;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    searchtet.tet = (tetrahedron *)((ulong)ppdVar3[this->point2simindex] & 0xfffffffffffffff0);
    if (searchtet.tet[4] == ppdVar3) {
      searchtet.ver = 0xb;
    }
    else if (searchtet.tet[5] == ppdVar3) {
      searchtet.ver = 3;
    }
    else {
      searchtet.ver = 7;
      if (searchtet.tet[6] != ppdVar3) {
        searchtet.ver = 0;
      }
    }
    local_a0.iloc = 1;
    local_a0.rejflag = 0;
    paVar18 = crosstets;
    iVar9 = insertpoint_cdt(this,steinpt,&searchtet,splitsh,&splitseg,&local_a0,cavpoints,cavfaces,
                            cavshells,newtets,crosstets,misfaces);
    if (iVar9 != 0) {
      if (this->useinsertradius != 0) {
        save_segmentpoint_insradius(this,pdVar8,local_a0.parentpt,local_a0.smlen);
      }
      this->st_segref_count = this->st_segref_count + 1;
      goto LAB_00138ced;
    }
  }
LAB_00138f92:
  puVar13 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar13 = 2;
  __cxa_throw(puVar13,&int::typeinfo,0);
}

Assistant:

void tetgenmesh::refineregion(face &splitsh, arraypool *cavpoints, 
                              arraypool *cavfaces, arraypool *cavshells,
                              arraypool *newtets, arraypool *crosstets,
                              arraypool *misfaces)
{
  triface searchtet, spintet;
  face splitseg, *paryseg;
  point steinpt, pa, pb, refpt;
  insertvertexflags ivf;
  enum interresult dir;
  long baknum = points->items;
  int t1ver;
  int i;

  if (b->verbose > 2) {
    printf("      Refining region at edge (%d, %d, %d).\n",
           pointmark(sorg(splitsh)), pointmark(sdest(splitsh)),
           pointmark(sapex(splitsh)));
  }

  // Add the Steiner point at the barycenter of the face.
  pa = sorg(splitsh);
  pb = sdest(splitsh);
  // Create a new point.
  makepoint(&steinpt, FREEFACETVERTEX);
  for (i = 0; i < 3; i++) {
    steinpt[i] = 0.5 * (pa[i] + pb[i]);
  }

  ivf.bowywat = 1; // Use the Bowyer-Watson algorrithm.
  ivf.cdtflag = 1; // Only create the initial cavity.
  ivf.sloc = (int) ONEDGE;
  ivf.sbowywat = 1;
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.

  point2tetorg(pa, searchtet); // Start location from it.
  ivf.iloc = (int) OUTSIDE;

  ivf.rejflag = 1; // Reject it if it encroaches upon any segment.
  if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, NULL, &ivf, cavpoints,
                       cavfaces, cavshells, newtets, crosstets, misfaces)) {
    if (ivf.iloc == (int) ENCSEGMENT) {
      pointdealloc(steinpt);
      // Split an encroached segment.
      i = randomnation(encseglist->objects);
      paryseg = (face *) fastlookup(encseglist, i);
      splitseg = *paryseg;
      encseglist->restart();

      // Split the segment.
      pa = sorg(splitseg);
      pb = sdest(splitseg);
      // Create a new point.
      makepoint(&steinpt, FREESEGVERTEX);
      for (i = 0; i < 3; i++) {
        steinpt[i] = 0.5 * (pa[i] + pb[i]);
      }
      point2tetorg(pa, searchtet);
      ivf.iloc = (int) OUTSIDE;
      ivf.rejflag = 0;
      if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, &splitseg, &ivf,
                           cavpoints, cavfaces, cavshells, newtets, 
                           crosstets, misfaces)) {
        terminatetetgen(this, 2); 
      }
      if (useinsertradius) {
        save_segmentpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
      }
      st_segref_count++;
      if (steinerleft > 0) steinerleft--;
    } else {
      terminatetetgen(this, 2); // assert(0);
    }
  } else {
    if (useinsertradius) {
      save_facetpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
    }
    st_facref_count++;
    if (steinerleft > 0) steinerleft--;
  }

  while (subsegstack->objects > 0l) {
    // seglist is used as a stack.
    subsegstack->objects--;
    paryseg = (face *) fastlookup(subsegstack, subsegstack->objects);
    splitseg = *paryseg;

    // Check if this segment has been recovered.
    sstpivot1(splitseg, searchtet);
    if (searchtet.tet != NULL) continue;

    // Search the segment.
    dir = scoutsegment(sorg(splitseg), sdest(splitseg), &splitseg, &searchtet, 
                       &refpt, NULL);
    if (dir == SHAREEDGE) {
      // Found this segment, insert it.
      // Let the segment remember an adjacent tet.
      sstbond1(splitseg, searchtet);
      // Bond the segment to all tets containing it.
      spintet = searchtet;
      do {
        tssbond1(spintet, splitseg);
        fnextself(spintet);
      } while (spintet.tet != searchtet.tet);
    } else { 
      if ((dir == ACROSSFACE) || (dir == ACROSSEDGE)) {
        // Split the segment.
        makepoint(&steinpt, FREESEGVERTEX);
        getsteinerptonsegment(&splitseg, refpt, steinpt);
        ivf.iloc = (int) OUTSIDE;
        ivf.rejflag = 0;
        if (!insertpoint_cdt(steinpt, &searchtet, &splitsh, &splitseg, &ivf,
                             cavpoints, cavfaces, cavshells, newtets, 
                             crosstets, misfaces)) {
          terminatetetgen(this, 2);
        }
        if (useinsertradius) {
          save_segmentpoint_insradius(steinpt, ivf.parentpt, ivf.smlen);
        }
        st_segref_count++;
        if (steinerleft > 0) steinerleft--;
      } else {
        terminatetetgen(this, 2);
      }
    }
  } // while

  if (b->verbose > 2) {
    printf("      Added %ld Steiner points.\n", points->items - baknum);
  }
}